

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Statements * __thiscall Parser::fileInput(Parser *this)

{
  bool bVar1;
  Statements *this_00;
  Statement *statement;
  Token tok;
  Token local_98;
  
  this_00 = (Statements *)operator_new(0x20);
  Statements::Statements(this_00);
  Tokenizer::getToken(&tok,this->tokenizer);
  while (tok._eof == false) {
    while (tok._eol == true) {
      Tokenizer::getToken(&local_98,this->tokenizer);
      Token::operator=(&tok,&local_98);
      Token::~Token(&local_98);
    }
    Tokenizer::ungetToken(this->tokenizer);
    statement = stmt(this);
    bVar1 = Token::isDef(&tok);
    if (bVar1) {
      statement->isFunction = true;
    }
    Statements::addStatement(this_00,statement);
    Tokenizer::getToken(&local_98,this->tokenizer);
    while( true ) {
      Token::operator=(&tok,&local_98);
      Token::~Token(&local_98);
      if (tok._eol != true) break;
      Tokenizer::getToken(&local_98,this->tokenizer);
    }
  }
  Tokenizer::ungetToken(this->tokenizer);
  Token::~Token(&tok);
  return this_00;
}

Assistant:

Statements *Parser::fileInput() {
    // file_input: {NEWLINE | stmt}* ENDMARKER
    auto *stmts = new Statements();
//    auto *funcs = new Functions();
    Token tok = tokenizer.getToken();
    while(!tok.eof()) {
        while(tok.eol())
            tok = tokenizer.getToken();
        tokenizer.ungetToken();
        Statement *statement = stmt();
        if(tok.isDef()) {
            statement->isFunction = true;
            //_functions->addFunction(dynamic_cast<Function *>(statement));
        }
        stmts->addStatement(statement);

        tok = tokenizer.getToken();
        while (tok.eol())
            tok = tokenizer.getToken();
//        if(tok.isDedent()){
//            tokenizer.ungetToken();
//            return stmts;
//        }
//
//        if(tok.eol()){
//        //    return stmts;
//        }
        //tok = tokenizer.getToken();
        //if(tok.isDedent()) break;


    }
    tokenizer.ungetToken();
    return stmts;
}